

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.hpp
# Opt level: O0

void __thiscall ot::commissioner::BorderAgent::~BorderAgent(BorderAgent *this)

{
  BorderAgent *this_local;
  
  ~BorderAgent(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~BorderAgent() = default;